

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::RepeatedEnumFieldGenerator::FinishInitialization
          (RepeatedEnumFieldGenerator *this)

{
  mapped_type *pmVar1;
  allocator local_111;
  key_type local_110;
  allocator local_e9;
  key_type local_e8;
  allocator local_b1;
  key_type local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  RepeatedEnumFieldGenerator *local_10;
  RepeatedEnumFieldGenerator *this_local;
  
  local_10 = this;
  RepeatedFieldGenerator::FinishInitialization(&this->super_RepeatedFieldGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"name",&local_b1);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                         super_SingleFieldGenerator.super_FieldGenerator.variables_,&local_b0);
  std::operator+(&local_90,"// |",pmVar1);
  std::operator+(&local_70,&local_90,"| contains |");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"storage_type",&local_e9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                         super_SingleFieldGenerator.super_FieldGenerator.variables_,&local_e8);
  std::operator+(&local_50,&local_70,pmVar1);
  std::operator+(&local_30,&local_50,"|\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"array_comment",&local_111);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                         super_SingleFieldGenerator.super_FieldGenerator.variables_,&local_110);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::FinishInitialization(void) {
  RepeatedFieldGenerator::FinishInitialization();
  variables_["array_comment"] =
      "// |" + variables_["name"] + "| contains |" + variables_["storage_type"] + "|\n";
}